

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O0

void nn_xpull_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_fq_data *data_00;
  nn_sockbase *local_30;
  nn_xpull_data *data;
  nn_xpull *xpull;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_30 = self;
  if (self == (nn_sockbase *)0x0) {
    local_30 = (nn_sockbase *)0x0;
  }
  data_00 = (nn_fq_data *)nn_pipe_getdata(pipe);
  nn_fq_rm((nn_fq *)(local_30 + 1),data_00);
  nn_free(data_00);
  return;
}

Assistant:

static void nn_xpull_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpull *xpull;
    struct nn_xpull_data *data;

    xpull = nn_cont (self, struct nn_xpull, sockbase);
    data = nn_pipe_getdata (pipe);
    nn_fq_rm (&xpull->fq, &data->fq);
    nn_free (data);
}